

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc-info.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar5;
  double alpha_1;
  double omega;
  double beta;
  double alpha;
  int rangesep;
  char *fname;
  xc_func_type func;
  int npar;
  int error;
  int func_id;
  int i;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffe10;
  xc_func_type *in_stack_fffffffffffffe18;
  double local_1e0;
  double local_1d8;
  uint local_1cc;
  char *local_1c8;
  xc_func_type local_1c0;
  uint local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    local_10 = in_RSI;
    pcVar1 = xc_version_string();
    printf("libxc version %s\n",pcVar1);
    pcVar1 = xc_reference();
    printf("%s\n",pcVar1);
    pcVar1 = xc_reference_doi();
    printf("doi: %s\n",pcVar1);
    printf("\n");
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*(char *)local_10[1]] & 0x400) == 0) {
      local_18 = atoi((char *)local_10[1]);
    }
    else {
      local_18 = xc_functional_get_number
                           ((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    }
    local_1c = xc_func_init(in_stack_fffffffffffffe18,
                            (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                            (int)in_stack_fffffffffffffe10);
    if (local_1c == 0) {
      local_1c8 = xc_functional_get_name(in_stack_fffffffffffffdec);
      printf("%10s: %-20i\n%10s: %-25s\n","func_id",(ulong)local_18,"name",local_1c8);
      pcVar1 = get_family((xc_func_type *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      pcVar3 = get_kind((xc_func_type *)
                        CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      printf("%10s: %-20s\n%10s: %-25s\n","family",pcVar1,"kind",pcVar3);
      printf("%10s: %s\n","comment",(local_1c0.info)->name);
      if ((((local_1c0.info)->family == 0x80) || ((local_1c0.info)->family == 0x20)) ||
         ((local_1c0.info)->family == 0x40)) {
        local_1cc = (uint)(((local_1c0.info)->flags & 0x100U) != 0);
        if (((local_1c0.info)->flags & 0x200U) != 0) {
          local_1cc = local_1cc + 1;
        }
        if (((local_1c0.info)->flags & 0x800U) != 0) {
          local_1cc = local_1cc + 1;
        }
        if (((local_1c0.info)->flags & 0x1000U) != 0) {
          local_1cc = local_1cc + 1;
        }
        if (local_1cc == 0) {
          dVar5 = xc_hyb_exx_coef(&local_1c0);
          printf("\nThis is a global hybrid functional with %4.1f%% of exact exchange.\n",
                 dVar5 * 100.0);
        }
        else {
          xc_hyb_cam_coef(&local_1c0,(double *)&stack0xfffffffffffffe18,&local_1d8,&local_1e0);
          printf("\nThis is a range-separated hybrid functional with range-separation constant % .3f,\n"
                 ,in_stack_fffffffffffffe18);
          printf("and %4.1f%% short-range and %4.1f%% long-range exact exchange,\n",
                 (local_1d8 + local_1e0) * 100.0,local_1d8 * 100.0);
          if ((((local_1c0.info)->flags & 0x100U) == 0) && (((local_1c0.info)->flags & 0x800U) == 0)
             ) {
            if ((((local_1c0.info)->flags & 0x200U) != 0) ||
               (((local_1c0.info)->flags & 0x1000U) != 0)) {
              printf("using the Yukawa kernel.\n");
            }
          }
          else {
            printf("using the error function kernel.\n");
          }
        }
      }
      else if (((local_1c0.info)->kind == 0) || ((local_1c0.info)->kind == 2)) {
        printf("\nThis is a pure functional with no exact exchange.\n");
      }
      printf("\nReference(s):\n");
      for (local_14 = 0;
          ((int)local_14 < 5 &&
          ((local_1c0.info)->refs[(int)local_14] != (func_reference_type *)0x0));
          local_14 = local_14 + 1) {
        printf("  *) %s\n",(local_1c0.info)->refs[(int)local_14]->ref);
        sVar4 = strlen((local_1c0.info)->refs[(int)local_14]->doi);
        if (sVar4 != 0) {
          printf("     doi: %s\n",(local_1c0.info)->refs[(int)local_14]->doi);
        }
        printf("     bibtex key: %s\n",(local_1c0.info)->refs[(int)local_14]->key);
      }
      printf("\nImplementation has support for:\n");
      if (((local_1c0.info)->flags & 1U) != 0) {
        printf("  *) energy\n");
      }
      if (((local_1c0.info)->flags & 2U) != 0) {
        printf("  *) first derivative\n");
      }
      if (((local_1c0.info)->flags & 4U) != 0) {
        printf("  *) second derivative\n");
      }
      if (((local_1c0.info)->flags & 8U) != 0) {
        printf("  *) third derivative\n");
      }
      if (((local_1c0.info)->flags & 8U) != 0) {
        printf("  *) fourth derivative\n");
      }
      printf("\nDefault thresholds:\n");
      printf("density: %e\n",local_1c0.dens_threshold);
      printf("   zeta: %e\n",local_1c0.zeta_threshold);
      if (((((local_1c0.info)->family == 2) || ((local_1c0.info)->family == 0x20)) ||
          ((local_1c0.info)->family == 4)) || ((local_1c0.info)->family == 0x40)) {
        printf("  sigma: %e\n",local_1c0.sigma_threshold);
      }
      if (((local_1c0.info)->family == 4) || ((local_1c0.info)->family == 0x40)) {
        printf("    tau: %e\n",local_1c0.tau_threshold);
      }
      local_20 = xc_func_info_get_n_ext_params(local_1c0.info);
      if ((int)local_20 < 1) {
        printf("\nFunctional has no external parameters.\n");
      }
      else {
        printf("\nFunctional has %i external parameters:\n",(ulong)local_20);
        printf("%3s %13s %8s %s\n","idx","value","name","description");
        for (local_14 = 0; (int)local_14 < (int)local_20; local_14 = local_14 + 1) {
          in_stack_fffffffffffffdf4 = local_14;
          dVar5 = xc_func_info_get_ext_params_default_value(local_1c0.info,local_14);
          pcVar1 = xc_func_info_get_ext_params_name(local_1c0.info,local_14);
          pcVar3 = xc_func_info_get_ext_params_description(local_1c0.info,local_14);
          printf("%3i % e %8s %s\n",dVar5,(ulong)in_stack_fffffffffffffdf4,pcVar1,pcVar3);
        }
      }
      xc_func_end((xc_func_type *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      libxc_free((void *)0x155a40);
      local_4 = 0;
    }
    else {
      printf("Functional \'%s\' not found.\n",local_10[1]);
      local_4 = 1;
    }
  }
  else {
    printf("Usage: %s [ func_id | func_name ]\n",*in_RSI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
  int i, func_id, error, npar;
  xc_func_type func;
  char *fname;

  if(argc!=2) {
    printf("Usage: %s [ func_id | func_name ]\n",argv[0]);
    return 1;
  }

  /* Print libxc information */
  printf("libxc version %s\n",xc_version_string());
  printf("%s\n", xc_reference());
  printf("doi: %s\n", xc_reference_doi());
  printf("\n");

  /* Is functional defined by a string constant? */
  if(isalpha(argv[1][0]))
    func_id = xc_functional_get_number(argv[1]);
  else
    func_id = atoi(argv[1]);

  /* Initialize functional */
  error = xc_func_init(&func, func_id, XC_UNPOLARIZED);
  if(error) {
    printf("Functional '%s' not found.\n", argv[1]);
    return 1;
  }

  /* Get functional name */
  fname = xc_functional_get_name(func_id);

  /* Print out info */
  printf("%10s: %-20i\n%10s: %-25s\n", "func_id", func_id, "name", fname);
  printf("%10s: %-20s\n%10s: %-25s\n", "family", get_family(&func), "kind", get_kind(&func));
  printf("%10s: %s\n", "comment", func.info->name);

  /* Print out hybrid exchange info */
  if(func.info->family==XC_FAMILY_HYB_LDA || func.info->family==XC_FAMILY_HYB_GGA || func.info->family==XC_FAMILY_HYB_MGGA) {
    /* Range separation? */
    int rangesep=0;
    if(func.info->flags & XC_FLAGS_HYB_CAM)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_CAMY)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_LC)
      rangesep++;
    if(func.info->flags & XC_FLAGS_HYB_LCY)
      rangesep++;

    if(rangesep) {
      double alpha, beta, omega;
      xc_hyb_cam_coef(&func,&omega,&alpha,&beta);
      printf("\nThis is a range-separated hybrid functional with range-separation constant % .3f,\n",omega);
      printf("and %4.1f%% short-range and %4.1f%% long-range exact exchange,\n",(alpha+beta)*100,(alpha)*100);

      if(func.info->flags & XC_FLAGS_HYB_CAM || func.info->flags & XC_FLAGS_HYB_LC)
        printf("using the error function kernel.\n");
      else if(func.info->flags & XC_FLAGS_HYB_CAMY || func.info->flags & XC_FLAGS_HYB_LCY)
        printf("using the Yukawa kernel.\n");
    } else {
      double alpha=xc_hyb_exx_coef(&func);
      printf("\nThis is a global hybrid functional with %4.1f%% of exact exchange.\n",alpha*100);
    }
  } else {
    if(func.info->kind == XC_EXCHANGE || func.info->kind == XC_EXCHANGE_CORRELATION)
      printf("\nThis is a pure functional with no exact exchange.\n");
  }

  printf("\nReference(s):\n");
  for(i = 0; i < 5; i++){
    if(func.info->refs[i] == NULL) break;
    printf("  *) %s\n", func.info->refs[i]->ref);
    if(strlen(func.info->refs[i]->doi) > 0){
       printf("     doi: %s\n", func.info->refs[i]->doi);
    }
    printf("     bibtex key: %s\n", func.info->refs[i]->key);
  }

  printf("\nImplementation has support for:\n");
  if(func.info->flags & XC_FLAGS_HAVE_EXC)
    printf("  *) energy\n");
  if(func.info->flags & XC_FLAGS_HAVE_VXC)
    printf("  *) first derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_FXC)
    printf("  *) second derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_KXC)
    printf("  *) third derivative\n");
  if(func.info->flags & XC_FLAGS_HAVE_KXC)
    printf("  *) fourth derivative\n");

  printf("\nDefault thresholds:\n");
  printf("density: %e\n",func.dens_threshold);
  printf("   zeta: %e\n",func.zeta_threshold);
  if(is_gga(func.info->family))
    printf("  sigma: %e\n",func.sigma_threshold);
  if(is_mgga(func.info->family))
    printf("    tau: %e\n",func.tau_threshold);
  
  /* Query parameters */
  npar = xc_func_info_get_n_ext_params(func.info);
  if(npar > 0) {
    printf("\nFunctional has %i external parameters:\n",npar);
    printf("%3s %13s %8s %s\n","idx","value","name","description");
    for(i = 0; i < npar; i++)
      printf("%3i % e %8s %s\n", i,
             xc_func_info_get_ext_params_default_value(func.info, i),
             xc_func_info_get_ext_params_name(func.info, i),
             xc_func_info_get_ext_params_description(func.info, i));
  } else {
    printf("\nFunctional has no external parameters.\n");
  }

  /* Free memory */
  xc_func_end(&func);
  libxc_free(fname);

  return 0;
}